

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField32.c
# Opt level: O3

void Hacl_GenericField32_exp_vartime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *aM,uint32_t bBits,
               uint32_t *b,uint32_t *resM)

{
  uint32_t *puVar1;
  size_t __n;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  uint32_t *puVar5;
  byte bVar6;
  sbyte sVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  uint32_t uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint32_t *puVar16;
  uint32_t *puVar17;
  uint uVar18;
  uint32_t auStack_e0 [4];
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  uint32_t *local_b8;
  uint32_t *t11_3;
  uint32_t *t11_2;
  uint32_t *t11_1;
  uint32_t *local_98;
  uint32_t *ctx_r2;
  ulong local_88;
  uint32_t *local_80;
  uint32_t *t11;
  ulong local_70;
  uint32_t *local_68;
  uint32_t *local_60;
  uint32_t *local_58;
  uint32_t *ctx_n;
  uint32_t *local_48;
  uint32_t *local_40;
  uint32_t *ctx_n0;
  
  uVar18 = k->len;
  uVar9 = (ulong)uVar18;
  ctx_n = k->n;
  uVar13 = k->mu;
  local_40 = k->r2;
  uVar10 = uVar9 * 4 + 0xf & 0xfffffffffffffff0;
  puVar17 = (uint32_t *)((long)auStack_e0 + -uVar10 + 8);
  __n = uVar9 * 4;
  ctx_r2 = b;
  local_60 = resM;
  local_48 = puVar17;
  *(undefined8 *)((long)auStack_e0 + -uVar10) = 0x13fc7e;
  memcpy(puVar17,aM,__n);
  local_70 = (ulong)bBits;
  ctx_n0._4_4_ = uVar13;
  if (bBits < 200) {
    puVar17 = (uint32_t *)((long)puVar17 - ((ulong)(uVar18 * 2) * 4 + 0xf & 0xfffffffffffffff0));
    uVar14 = 0;
    puVar17[-2] = 0x13fcc0;
    puVar17[-1] = 0;
    memset(puVar17,0,(ulong)(uVar18 * 2) << 2);
    puVar12 = ctx_n;
    puVar17[-2] = 0x13fccf;
    puVar17[-1] = 0;
    memcpy(puVar17,puVar12,__n);
    puVar12 = local_40;
    puVar17[-2] = 0x13fce2;
    puVar17[-1] = 0;
    memcpy(puVar17 + uVar9,puVar12,__n);
    uVar13 = ctx_n0._4_4_;
    puVar12 = local_60;
    local_40 = puVar17;
    puVar17[-2] = 0x13fcfb;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar18,puVar17,uVar13,puVar17 + uVar9,puVar12);
    uVar13 = ctx_n0._4_4_;
    puVar16 = local_40;
    puVar12 = local_48;
    if ((int)local_70 != 0) {
      do {
        puVar1 = local_60;
        if ((ctx_r2[uVar14 >> 5] >> (uVar14 & 0x1f) & 1) != 0) {
          puVar17[-2] = 0x13fd44;
          puVar17[-1] = 0;
          Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar18,puVar16,uVar13,puVar1,puVar12,puVar1);
        }
        puVar17[-2] = 0x13fd58;
        puVar17[-1] = 0;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar18,puVar16,uVar13,puVar12,puVar12);
        uVar14 = uVar14 + 1;
      } while ((uint)local_70 != uVar14);
    }
  }
  else {
    t11._4_4_ = bBits - 1 >> 5;
    local_68 = (uint32_t *)(ulong)(uVar18 * 2);
    puVar17 = (uint32_t *)((long)puVar17 - ((long)local_68 * 4 + 0xfU & 0xfffffffffffffff0));
    sVar2 = (long)local_68 * 4;
    local_58 = puVar17;
    puVar17[-2] = 0x13fda6;
    puVar17[-1] = 0;
    memset(puVar17,0,sVar2);
    puVar12 = ctx_n;
    puVar17[-2] = 0x13fdb5;
    puVar17[-1] = 0;
    memcpy(puVar17,puVar12,__n);
    puVar12 = local_40;
    local_98 = puVar17 + uVar9;
    puVar17[-2] = 0x13fdcc;
    puVar17[-1] = 0;
    memcpy(puVar17 + uVar9,puVar12,__n);
    local_d0 = (ulong)(uVar18 << 4);
    sVar2 = local_d0 * 4;
    puVar17 = puVar17 + -local_d0;
    ctx_n = puVar17;
    puVar17[-2] = 0x13fdf5;
    puVar17[-1] = 0;
    memset(puVar17,0,sVar2);
    puVar17 = (uint32_t *)((long)puVar17 - uVar10);
    local_88 = uVar10;
    puVar17[-2] = 0x13fe12;
    puVar17[-1] = 0;
    memset(puVar17,0,__n);
    puVar1 = ctx_n;
    puVar11 = local_58;
    puVar16 = local_98;
    puVar12 = ctx_n + uVar9;
    local_40 = (uint32_t *)__n;
    puVar17[-2] = 0x13fe37;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar18,puVar11,uVar13,puVar16,puVar1);
    puVar1 = local_40;
    puVar16 = local_48;
    puVar17[-2] = 0x13fe47;
    puVar17[-1] = 0;
    memcpy(puVar12,puVar16,(size_t)puVar1);
    puVar17[-2] = 0x13fe5b;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar18,puVar11,uVar13,puVar12,puVar17);
    puVar16 = local_40;
    puVar12 = ctx_n + (long)local_68;
    puVar17[-2] = 0x13fe76;
    puVar17[-1] = 0;
    memcpy(puVar12,puVar17,(size_t)puVar16);
    puVar16 = local_48;
    puVar17[-2] = 0x13fe8e;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar18,puVar11,uVar13,puVar16,puVar12,puVar17);
    puVar5 = local_40;
    puVar1 = ctx_n;
    local_c8 = (ulong)(uVar18 * 3);
    puVar16 = ctx_n + local_c8;
    local_80 = puVar16;
    puVar17[-2] = 0x13feb1;
    puVar17[-1] = 0;
    memcpy(puVar16,puVar17,(size_t)puVar5);
    uVar13 = ctx_n0._4_4_;
    puVar17[-2] = 0x13fec7;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar18,puVar11,uVar13,puVar12,puVar17);
    puVar16 = local_40;
    local_c0 = (ulong)(uVar18 * 4);
    puVar12 = puVar1 + local_c0;
    t11_2 = puVar12;
    puVar17[-2] = 0x13fef0;
    puVar17[-1] = 0;
    memcpy(puVar12,puVar17,(size_t)puVar16);
    puVar11 = local_48;
    puVar16 = local_58;
    puVar17[-2] = 0x13ff08;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar18,puVar16,uVar13,puVar11,puVar12,puVar17);
    puVar16 = local_40;
    t11_1 = (uint32_t *)(ulong)(uVar18 * 5);
    puVar12 = puVar1 + (long)t11_1;
    t11_3 = puVar12;
    puVar17[-2] = 0x13ff2a;
    puVar17[-1] = 0;
    memcpy(puVar12,puVar17,(size_t)puVar16);
    uVar13 = ctx_n0._4_4_;
    puVar16 = local_58;
    puVar12 = local_80;
    puVar17[-2] = 0x13ff47;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar18,puVar16,uVar13,puVar12,puVar17);
    puVar12 = local_40;
    puVar1 = puVar1 + (uint)((int)local_68 * 3);
    local_b8 = puVar1;
    puVar17[-2] = 0x13ff68;
    puVar17[-1] = 0;
    memcpy(puVar1,puVar17,(size_t)puVar12);
    puVar12 = local_48;
    puVar17[-2] = 0x13ff80;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar18,puVar16,uVar13,puVar12,puVar1,puVar17);
    puVar12 = local_40;
    puVar1 = ctx_n;
    puVar16 = ctx_n + uVar18 * 7;
    local_80 = puVar16;
    puVar17[-2] = 0x13ffac;
    puVar17[-1] = 0;
    memcpy(puVar16,puVar17,(size_t)puVar12);
    uVar13 = ctx_n0._4_4_;
    puVar16 = local_58;
    puVar12 = t11_2;
    puVar17[-2] = 0x13ffc8;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar18,puVar16,uVar13,puVar12,puVar17);
    puVar12 = local_40;
    puVar11 = puVar1 + uVar18 * 8;
    puVar17[-2] = 0x13ffe2;
    puVar17[-1] = 0;
    memcpy(puVar11,puVar17,(size_t)puVar12);
    uVar13 = ctx_n0._4_4_;
    puVar12 = local_48;
    puVar17[-2] = 0x13fffa;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar18,puVar16,uVar13,puVar12,puVar11,puVar17);
    puVar12 = local_40;
    puVar17[-2] = 0x140015;
    puVar17[-1] = 0;
    memcpy(puVar1 + uVar18 * 9,puVar17,(size_t)puVar12);
    uVar13 = ctx_n0._4_4_;
    puVar12 = t11_3;
    puVar17[-2] = 0x140034;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar18,puVar16,uVar13,puVar12,puVar17);
    puVar1 = local_40;
    puVar12 = ctx_n + (uint)((int)local_68 * 5);
    puVar17[-2] = 0x140052;
    puVar17[-1] = 0;
    memcpy(puVar12,puVar17,(size_t)puVar1);
    puVar1 = local_48;
    puVar17[-2] = 0x14006a;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar18,puVar16,uVar13,puVar1,puVar12,puVar17);
    puVar1 = local_40;
    puVar11 = ctx_n;
    puVar12 = ctx_n + (uVar18 + (int)t11_1 * 2);
    puVar17[-2] = 0x140089;
    puVar17[-1] = 0;
    memcpy(puVar12,puVar17,(size_t)puVar1);
    uVar13 = ctx_n0._4_4_;
    puVar12 = local_b8;
    puVar17[-2] = 0x1400a1;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar18,puVar16,uVar13,puVar12,puVar17);
    puVar12 = local_40;
    iVar3 = (int)local_c0;
    puVar17[-2] = 0x1400be;
    puVar17[-1] = 0;
    memcpy(puVar11 + (uint)(iVar3 * 3),puVar17,(size_t)puVar12);
    uVar13 = ctx_n0._4_4_;
    puVar12 = local_48;
    puVar17[-2] = 0x1400d8;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32
              (uVar18,puVar16,uVar13,puVar12,puVar11 + (uint)(iVar3 * 3),puVar17);
    puVar12 = local_40;
    iVar3 = (int)local_c8;
    puVar17[-2] = 0x1400f3;
    puVar17[-1] = 0;
    memcpy(puVar11 + (uVar18 + iVar3 * 4),puVar17,(size_t)puVar12);
    puVar16 = local_58;
    puVar12 = local_80;
    puVar17[-2] = 0x140108;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar18,puVar16,uVar13,puVar12,puVar17);
    puVar12 = local_40;
    uVar14 = (int)local_d0 - (int)local_68;
    puVar17[-2] = 0x140125;
    puVar17[-1] = 0;
    memcpy(puVar11 + uVar14,puVar17,(size_t)puVar12);
    uVar13 = ctx_n0._4_4_;
    puVar5 = local_40;
    puVar12 = local_48;
    puVar1 = local_58;
    puVar17[-2] = 0x140145;
    puVar17[-1] = 0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar18,puVar1,uVar13,puVar12,puVar11 + uVar14,puVar17);
    uVar4 = local_70;
    iVar3 = (int)t11_1;
    puVar17[-2] = 0x140162;
    puVar17[-1] = 0;
    memcpy(puVar11 + (uint)(iVar3 * 3),puVar17,(size_t)puVar5);
    uVar13 = ctx_n0._4_4_;
    puVar16 = local_60;
    uVar10 = local_88;
    puVar12 = local_98;
    local_48 = (uint32_t *)uVar9;
    if ((uVar4 & 3) == 0) {
      puVar17[-2] = 0x1401e0;
      puVar17[-1] = 0;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(uVar18,puVar1,uVar13,puVar12,puVar16);
      uVar10 = local_88;
    }
    else {
      uVar9 = uVar4 >> 5 & 0x7ffffff;
      bVar6 = (byte)uVar4 & 0x1c;
      uVar14 = ctx_r2[uVar9] >> bVar6;
      if ((uVar4 & 0x1c) != 0 && (uint)uVar9 < t11._4_4_) {
        uVar14 = ctx_r2[uVar9 + 1] << (-bVar6 & 0x1f) | uVar14;
      }
      puVar12 = ctx_n + (uVar14 & 0xf) * uVar18;
      puVar17[-2] = 0x1401c5;
      puVar17[-1] = 0;
      memcpy(puVar16,puVar12,(size_t)puVar5);
    }
    puVar17 = (uint32_t *)((long)puVar17 - uVar10);
    local_68 = puVar17;
    puVar17[-2] = 0x1401fb;
    puVar17[-1] = 0;
    memset(puVar17,0,(size_t)puVar5);
    uVar10 = uVar4 >> 2 & 0x3fffffff;
    uVar18 = (uint)uVar4 & 0xfffffffc;
    puVar12 = local_58;
    puVar16 = local_48;
    uVar13 = ctx_n0._4_4_;
    do {
      puVar1 = local_60;
      uVar18 = uVar18 - 4;
      local_70 = CONCAT44(local_70._4_4_,(int)uVar10);
      uVar15 = (uint32_t)puVar16;
      puVar17[-2] = 0x140230;
      puVar17[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar15,puVar12,uVar13,puVar1,puVar1);
      puVar17[-2] = 0x140244;
      puVar17[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar15,puVar12,uVar13,puVar1,puVar1);
      puVar17[-2] = 0x140258;
      puVar17[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar15,puVar12,uVar13,puVar1,puVar1);
      puVar17[-2] = 0x14026c;
      puVar17[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(uVar15,puVar12,uVar13,puVar1,puVar1);
      puVar12 = local_40;
      puVar16 = local_48;
      puVar1 = local_68;
      uVar8 = uVar18 >> 5;
      sVar7 = (sbyte)(uVar18 & 0x1c);
      uVar14 = ctx_r2[uVar8] >> sVar7;
      if ((uVar18 & 0x1c) != 0 && uVar8 < t11._4_4_) {
        uVar14 = ctx_r2[(ulong)uVar8 + 1] << (-sVar7 & 0x1fU) | uVar14;
      }
      uVar15 = (uint32_t)local_48;
      puVar11 = ctx_n + (uVar14 & 0xf) * uVar15;
      puVar17[-2] = 0x1402c7;
      puVar17[-1] = 0;
      memcpy(puVar1,puVar11,(size_t)puVar12);
      uVar13 = ctx_n0._4_4_;
      puVar12 = local_58;
      puVar11 = local_60;
      puVar17[-2] = 0x1402e7;
      puVar17[-1] = 0;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(uVar15,puVar12,uVar13,puVar11,puVar1,puVar11);
      uVar10 = (ulong)((int)local_70 - 1U);
    } while ((int)local_70 - 1U != 0);
  }
  return;
}

Assistant:

void
Hacl_GenericField32_exp_vartime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *aM,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *resM
)
{
  uint32_t len1 = Hacl_GenericField32_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint32_t), k1.len);
  uint32_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint32_t));
  memcpy(aMc, aM, k1.len * sizeof (uint32_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 32U;
      uint32_t j = i % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      if (!(bit == 0U))
      {
        uint32_t *ctx_n0 = ctx;
        Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n0, k1.mu, resM, aMc, resM);
      }
      uint32_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n0, k1.mu, aMc, aMc);
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 32U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1 + len1);
    uint32_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint32_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint32_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), 16U * len1);
    uint32_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint32_t));
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint32_t));
    uint32_t *t0 = table;
    uint32_t *t1 = table + len1;
    uint32_t *ctx_n0 = ctx;
    uint32_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint32_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint32_t *t11 = table + (i + 1U) * len1;
      uint32_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint32_t));
      uint32_t *t2 = table + (2U * i + 2U) * len1;
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint32_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i = bBits / 4U * 4U;
      uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i, 4U);
      uint32_t bits_l32 = bits_c;
      const uint32_t *a_bits_l = table + bits_l32 * len1;
      memcpy(resM, (uint32_t *)a_bits_l, len1 * sizeof (uint32_t));
    }
    else
    {
      uint32_t *ctx_n = ctx;
      uint32_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u32(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint32_t), len1);
    uint32_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint32_t));
    for (uint32_t i = 0U; i < bBits / 4U; i++)
    {
      KRML_MAYBE_FOR4(i0,
        0U,
        4U,
        1U,
        uint32_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u32(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i - 4U;
      uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k2, 4U);
      uint32_t bits_l32 = bits_l;
      const uint32_t *a_bits_l = table + bits_l32 * len1;
      memcpy(tmp0, (uint32_t *)a_bits_l, len1 * sizeof (uint32_t));
      uint32_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u32(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}